

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vampire.cpp
# Opt level: O2

void outputMode(Problem *problem)

{
  Unit **ppUVar1;
  bool bVar2;
  ostream *poVar3;
  Unit *extraout_RDX;
  Unit *unit;
  Unit *extraout_RDX_00;
  UnitList *pUVar4;
  ScopedPtr<Kernel::Problem> prb;
  ScopedPtr<Kernel::Problem> local_50;
  string local_48;
  
  local_50._obj = problem;
  Shell::UIHelper::outputSymbolDeclarations((ostream *)&std::cout);
  pUVar4 = problem->_units;
  unit = extraout_RDX;
  while (pUVar4 != (UnitList *)0x0) {
    ppUVar1 = &pUVar4->_head;
    pUVar4 = pUVar4->_tail;
    Shell::TPTPPrinter::toString_abi_cxx11_(&local_48,(TPTPPrinter *)*ppUVar1,unit);
    poVar3 = std::operator<<((ostream *)&std::cout,(string *)&local_48);
    std::operator<<(poVar3,"\n");
    std::__cxx11::string::~string((string *)&local_48);
    unit = extraout_RDX_00;
  }
  std::__cxx11::string::string((string *)&local_48,(string *)(Lib::env + 0x6a70));
  bVar2 = std::operator!=(&local_48,"off");
  std::__cxx11::string::~string((string *)&local_48);
  if (bVar2) {
    outputProblemToLaTeX(local_50._obj);
  }
  vampireReturnValue = 0;
  Lib::ScopedPtr<Kernel::Problem>::~ScopedPtr(&local_50);
  return;
}

Assistant:

void outputMode(Problem* problem)
{
  ScopedPtr<Problem> prb(problem);

  //outputSymbolDeclarations also deals with sorts for now
  //UIHelper::outputSortDeclarations(std::cout);
  UIHelper::outputSymbolDeclarations(std::cout);
  UnitList::Iterator units(prb->units());

  while (units.hasNext()) {
    Unit* u = units.next();
    std::cout << TPTPPrinter::toString(u) << "\n";
  }

  if(env.options->latexOutput()!="off"){ outputProblemToLaTeX(prb.ptr()); }

  //we have successfully output all clauses, so we'll terminate with zero return value
  vampireReturnValue = VAMP_RESULT_STATUS_SUCCESS;
}